

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O2

void __thiscall mraa::Iio::Iio(Iio *this,string *deviceName)

{
  int iVar1;
  mraa_iio_context p_Var2;
  ostream *poVar3;
  invalid_argument *piVar4;
  string local_1b0 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  iVar1 = mraa_iio_get_device_num_by_name((deviceName->_M_dataplus)._M_p);
  if (iVar1 == -1) {
    poVar3 = std::operator<<((ostream *)&oss,"IIO device name ");
    poVar3 = std::operator<<(poVar3,(string *)deviceName);
    std::operator<<(poVar3," not found");
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar4,local_1b0);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  p_Var2 = (mraa_iio_context)mraa_iio_init(iVar1);
  this->m_iio = p_Var2;
  if (p_Var2 != (mraa_iio_context)0x0) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    return;
  }
  poVar3 = std::operator<<((ostream *)&oss,"IIO device ");
  poVar3 = std::operator<<(poVar3,(string *)deviceName);
  std::operator<<(poVar3," is not valid");
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar4,local_1b0);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Iio(const std::string& deviceName)
    {
        std::ostringstream oss;
        int id = mraa_iio_get_device_num_by_name(deviceName.c_str());
        if (id == -1) {
            oss << "IIO device name " << deviceName << " not found";
            throw std::invalid_argument(oss.str());
        }
        m_iio = mraa_iio_init(id);
        if (m_iio == NULL) {
            oss << "IIO device " << deviceName << " is not valid";
            throw std::invalid_argument(oss.str());
        }
    }